

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easygetopt.c
# Opt level: O2

curl_easyoption * lookup(char *name,CURLoption id)

{
  curl_easyoption *pcVar1;
  int iVar2;
  curl_easyoption *o;
  curl_easyoption *pcVar3;
  
  if (name != (char *)0x0 || id != 0) {
    pcVar3 = Curl_easyopts;
    do {
      if (name == (char *)0x0) {
        if ((pcVar3->id == id) && ((pcVar3->flags & 1) == 0)) {
          return pcVar3;
        }
      }
      else {
        iVar2 = curl_strequal(pcVar3->name,name);
        if (iVar2 != 0) {
          return pcVar3;
        }
      }
      pcVar1 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
    } while (pcVar1->name != (char *)0x0);
  }
  return (curl_easyoption *)0x0;
}

Assistant:

static struct curl_easyoption *lookup(const char *name, CURLoption id)
{
  DEBUGASSERT(name || id);
  DEBUGASSERT(!Curl_easyopts_check());
  if(name || id) {
    struct curl_easyoption *o = &Curl_easyopts[0];
    do {
      if(name) {
        if(strcasecompare(o->name, name))
          return o;
      }
      else {
        if((o->id == id) && !(o->flags & CURLOT_FLAG_ALIAS))
          /* do not match alias options */
          return o;
      }
      o++;
    } while(o->name);
  }
  return NULL;
}